

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

bool __thiscall
helics::apps::AppTextParser::loadNextLine(AppTextParser *this,string *line,int *lineNumber)

{
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  char *pcVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  byte *in_RDI;
  size_type firstChar;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd8;
  
  do {
    while( true ) {
      while( true ) {
        do {
          piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)(in_RDI + 8),(string *)in_RSI);
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
          if (!bVar1) {
            return false;
          }
          *(int *)(in_RDI + 0x250) = *(int *)(in_RDI + 0x250) + 1;
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x207c06);
        } while ((bVar1) ||
                (in_stack_ffffffffffffffd8 =
                      (char *)CLI::std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              find_first_not_of(in_RDX,in_stack_ffffffffffffffd8,(size_type)in_RDI),
                in_stack_ffffffffffffffd8 == (char *)0xffffffffffffffff));
        if ((*in_RDI & 1) == 0) break;
        pcVar3 = in_stack_ffffffffffffffd8 + 2;
        pcVar4 = (char *)CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                   (in_RSI);
        if (((pcVar3 < pcVar4) &&
            (pvVar5 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
            *pvVar5 == '#')) &&
           ((pvVar5 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
            *pvVar5 == '#' &&
            (pvVar5 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
            *pvVar5 == ']')))) {
          *in_RDI = 0;
        }
      }
      pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (*pvVar5 != '#') break;
      in_stack_ffffffffffffffc0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (in_stack_ffffffffffffffd8 + 2);
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::size(in_RSI);
      if (((in_stack_ffffffffffffffc0 < pbVar6) &&
          (pvVar5 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), *pvVar5 == '#')
          ) && (pvVar5 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
               *pvVar5 == '[')) {
        *in_RDI = 1;
      }
    }
    pvVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  } while (*pvVar5 == '!');
  *(undefined4 *)&(in_RDX->_M_dataplus)._M_p = *(undefined4 *)(in_RDI + 0x250);
  return true;
}

Assistant:

bool AppTextParser::loadNextLine(std::string& line, int& lineNumber)
{
    while (std::getline(filePtr, line)) {
        ++currentLineNumber;
        if (line.empty()) {
            continue;
        }
        auto firstChar = line.find_first_not_of(" \t\n\r\0");
        if (firstChar == std::string::npos) {
            continue;
        }
        if (mLineComment) {
            if (firstChar + 2 < line.size()) {
                if ((line[firstChar] == '#') && (line[firstChar + 1] == '#') &&
                    (line[firstChar + 2] == ']')) {
                    mLineComment = false;
                }
            }
            continue;
        }
        if (line[firstChar] == '#') {
            if (firstChar + 2 < line.size()) {
                if ((line[firstChar + 1] == '#') && (line[firstChar + 2] == '[')) {
                    mLineComment = true;
                }
            }
            continue;
        }
        if (line[firstChar] == '!') {
            continue;
        }
        lineNumber = currentLineNumber;
        return true;
    }
    return false;
}